

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_avx2.c
# Opt level: O0

void store_vertical_filter_output_avx2
               (__m256i *res_lo,__m256i *res_hi,__m256i *res_add_const,__m256i *wt,
               __m256i *res_sub_const,__m256i *round_bits_const,uint8_t *pred,
               ConvolveParams *conv_params,int i,int j,int k,int reduce_bits_vert,int p_stride,
               int p_width,int round_bits)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  ulong *puVar8;
  ulong *puVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  undefined1 (*in_RCX) [32];
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  undefined1 (*in_R8) [32];
  undefined1 (*in_R9) [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  long in_stack_00000008;
  __m256i res_16bit;
  __m256i res_hi_round;
  __m256i res_lo_round;
  __m128i temp_hi_16_1;
  __m128i temp_hi_16_0;
  __m128i res_8_hi_1;
  __m128i res_8_hi_0;
  __m256i res_8_hi;
  __m256i shifted_32_1;
  __m256i wt_res_hi;
  __m256i p_16_hi;
  __m256i p4_16;
  __m128i p4_16_1;
  __m128i p4_16_0;
  __m128i *dst8_4_1;
  __m128i *dst8_4_0;
  __m256i res_hi_16;
  __m256i temp_hi_16;
  __m128i *p4_1;
  __m128i *p4_0;
  __m128i temp_lo_16_1;
  __m128i temp_lo_16_0;
  __m128i res_8_lo_1;
  __m128i res_8_lo_0;
  __m256i res_8_lo;
  __m256i shifted_32;
  __m256i wt_res_lo;
  __m256i p_16_lo;
  __m256i p_16;
  __m128i p_16_1;
  __m128i p_16_0;
  __m128i *dst8_1;
  __m128i *dst8_0;
  __m256i res_lo_16;
  __m256i temp_lo_16;
  __m128i *p_1;
  __m128i *p_0;
  __m256i res_hi_1;
  __m256i res_lo_1;
  undefined8 local_f00;
  undefined8 uStack_ef0;
  ulong local_e80;
  undefined4 local_e60;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined1 local_d60 [32];
  ulong uStack_d30;
  ulong local_d00;
  undefined4 local_ce0;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined1 local_be0 [32];
  ulong uStack_bb0;
  undefined4 local_200;
  undefined4 local_1e0;
  undefined4 local_1a0;
  undefined4 local_160;
  
  auVar2 = *in_RSI;
  if (*(int *)(pred + 0x20) == 0) {
    auVar1 = vpaddd_avx2(*in_RDI,*in_RDX);
    auVar1 = vpsrad_avx2(auVar1,ZEXT416((uint)k));
    auVar2 = vpaddd_avx2(auVar2,*in_RDX);
    auVar2 = vpsrad_avx2(auVar2,ZEXT416((uint)k));
    auVar2 = vpackssdw_avx2(auVar1,auVar2);
    auVar2 = vpackuswb_avx2(auVar2,auVar2);
    local_f00 = auVar2._0_8_;
    uStack_ef0 = auVar2._16_8_;
    puVar10 = (undefined8 *)
              (in_stack_00000008 + (((int)conv_params + j + 4) * reduce_bits_vert + i));
    puVar11 = (undefined8 *)
              (in_stack_00000008 + (((int)conv_params + j + 5) * reduce_bits_vert + i));
    if (p_stride == 4) {
      local_1e0 = auVar2._0_4_;
      *(undefined4 *)puVar10 = local_1e0;
      local_200 = auVar2._16_4_;
      *(undefined4 *)puVar11 = local_200;
    }
    else {
      *puVar10 = local_f00;
      *puVar11 = uStack_ef0;
    }
  }
  else {
    puVar8 = (ulong *)(*(long *)(pred + 8) +
                      (long)(((int)conv_params + j + 4) * *(int *)(pred + 0x10) + i) * 2);
    puVar9 = (ulong *)(*(long *)(pred + 8) +
                      (long)(((int)conv_params + j + 5) * *(int *)(pred + 0x10) + i) * 2);
    auVar1 = vpaddd_avx2(*in_RDI,*in_RDX);
    auVar1 = vpsrad_avx2(auVar1,ZEXT416((uint)k));
    auVar1 = vpackusdw_avx2(auVar1,auVar1);
    if (*(int *)pred == 0) {
      uStack_bb0 = auVar1._16_8_;
      *puVar8 = uStack_bb0;
      *puVar9 = local_d00;
    }
    else {
      auVar12._8_8_ = 0;
      auVar12._0_8_ = *puVar8;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = *puVar9;
      auVar12 = ZEXT116(0) * auVar13 + ZEXT116(1) * auVar12;
      auVar13 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar13;
      uStack_c30 = auVar13._0_8_;
      uStack_c28 = auVar13._8_8_;
      if (*(int *)(pred + 0x24) == 0) {
        auVar7._16_8_ = uStack_c30;
        auVar7._0_16_ = auVar12;
        auVar7._24_8_ = uStack_c28;
        auVar1 = vpaddw_avx2(auVar7,auVar1);
        local_be0 = vpsraw_avx2(auVar1,ZEXT416(1));
      }
      else {
        auVar6._16_8_ = uStack_c30;
        auVar6._0_16_ = auVar12;
        auVar6._24_8_ = uStack_c28;
        auVar1 = vpunpcklwd_avx2(auVar6,auVar1);
        auVar1 = vpmaddwd_avx2(auVar1,*in_RCX);
        auVar1 = vpsrad_avx2(auVar1,ZEXT416(4));
        local_be0 = vpackusdw_avx2(auVar1,auVar1);
      }
      auVar1 = vpaddw_avx2(local_be0,*in_R8);
      auVar1 = vpaddw_avx2(auVar1,*in_R9);
      auVar1 = vpsraw_avx2(auVar1,ZEXT416((uint)p_width));
      auVar1 = vpackuswb_avx2(auVar1,auVar1);
      local_160 = auVar1._16_4_;
      *(undefined4 *)(in_stack_00000008 + (((int)conv_params + 4 + j) * reduce_bits_vert + i)) =
           local_160;
      *(undefined4 *)(in_stack_00000008 + ((j + 5 + (int)conv_params) * reduce_bits_vert + i)) =
           local_ce0;
    }
    if (4 < p_stride) {
      puVar8 = (ulong *)(*(long *)(pred + 8) +
                        (long)(((int)conv_params + j + 4) * *(int *)(pred + 0x10) + i + 4) * 2);
      puVar9 = (ulong *)(*(long *)(pred + 8) +
                        (long)(((int)conv_params + j + 5) * *(int *)(pred + 0x10) + i + 4) * 2);
      auVar2 = vpaddd_avx2(auVar2,*in_RDX);
      auVar2 = vpsrad_avx2(auVar2,ZEXT416((uint)k));
      auVar2 = vpackusdw_avx2(auVar2,auVar2);
      if (*(int *)pred == 0) {
        uStack_d30 = auVar2._16_8_;
        *puVar8 = uStack_d30;
        *puVar9 = local_e80;
      }
      else {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = *puVar8;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = *puVar9;
        auVar13 = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar4;
        auVar12 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar3;
        uStack_db0 = auVar12._0_8_;
        uStack_da8 = auVar12._8_8_;
        if (*(int *)(pred + 0x24) == 0) {
          auVar1._16_8_ = uStack_db0;
          auVar1._0_16_ = auVar13;
          auVar1._24_8_ = uStack_da8;
          auVar2 = vpaddw_avx2(auVar1,auVar2);
          local_d60 = vpsraw_avx2(auVar2,ZEXT416(1));
        }
        else {
          auVar5._16_8_ = uStack_db0;
          auVar5._0_16_ = auVar13;
          auVar5._24_8_ = uStack_da8;
          auVar2 = vpunpcklwd_avx2(auVar5,auVar2);
          auVar2 = vpmaddwd_avx2(auVar2,*in_RCX);
          auVar2 = vpsrad_avx2(auVar2,ZEXT416(4));
          local_d60 = vpackusdw_avx2(auVar2,auVar2);
        }
        auVar2 = vpaddw_avx2(local_d60,*in_R8);
        auVar2 = vpaddw_avx2(auVar2,*in_R9);
        auVar2 = vpsraw_avx2(auVar2,ZEXT416((uint)p_width));
        auVar2 = vpackuswb_avx2(auVar2,auVar2);
        local_1a0 = auVar2._16_4_;
        *(undefined4 *)
         ((long)(((int)conv_params + 4 + j) * reduce_bits_vert + i) + 4 + in_stack_00000008) =
             local_1a0;
        *(undefined4 *)
         ((long)((j + 5 + (int)conv_params) * reduce_bits_vert + i) + 4 + in_stack_00000008) =
             local_e60;
      }
    }
  }
  return;
}

Assistant:

static inline void store_vertical_filter_output_avx2(
    const __m256i *res_lo, const __m256i *res_hi, const __m256i *res_add_const,
    const __m256i *wt, const __m256i *res_sub_const,
    const __m256i *round_bits_const, uint8_t *pred, ConvolveParams *conv_params,
    int i, int j, int k, const int reduce_bits_vert, int p_stride, int p_width,
    const int round_bits) {
  __m256i res_lo_1 = *res_lo;
  __m256i res_hi_1 = *res_hi;

  if (conv_params->is_compound) {
    __m128i *const p_0 =
        (__m128i *)&conv_params->dst[(i + k + 4) * conv_params->dst_stride + j];
    __m128i *const p_1 =
        (__m128i *)&conv_params
            ->dst[(i + (k + 1) + 4) * conv_params->dst_stride + j];

    res_lo_1 = _mm256_srai_epi32(_mm256_add_epi32(res_lo_1, *res_add_const),
                                 reduce_bits_vert);

    const __m256i temp_lo_16 = _mm256_packus_epi32(res_lo_1, res_lo_1);
    __m256i res_lo_16;
    if (conv_params->do_average) {
      __m128i *const dst8_0 = (__m128i *)&pred[(i + k + 4) * p_stride + j];
      __m128i *const dst8_1 =
          (__m128i *)&pred[(i + (k + 1) + 4) * p_stride + j];
      const __m128i p_16_0 = _mm_loadl_epi64(p_0);
      const __m128i p_16_1 = _mm_loadl_epi64(p_1);
      const __m256i p_16 =
          _mm256_inserti128_si256(_mm256_castsi128_si256(p_16_0), p_16_1, 1);
      if (conv_params->use_dist_wtd_comp_avg) {
        const __m256i p_16_lo = _mm256_unpacklo_epi16(p_16, temp_lo_16);
        const __m256i wt_res_lo = _mm256_madd_epi16(p_16_lo, *wt);
        const __m256i shifted_32 =
            _mm256_srai_epi32(wt_res_lo, DIST_PRECISION_BITS);
        res_lo_16 = _mm256_packus_epi32(shifted_32, shifted_32);
      } else {
        res_lo_16 = _mm256_srai_epi16(_mm256_add_epi16(p_16, temp_lo_16), 1);
      }
      res_lo_16 = _mm256_add_epi16(res_lo_16, *res_sub_const);
      res_lo_16 = _mm256_srai_epi16(
          _mm256_add_epi16(res_lo_16, *round_bits_const), round_bits);
      const __m256i res_8_lo = _mm256_packus_epi16(res_lo_16, res_lo_16);
      const __m128i res_8_lo_0 = _mm256_castsi256_si128(res_8_lo);
      const __m128i res_8_lo_1 = _mm256_extracti128_si256(res_8_lo, 1);
      *(int *)dst8_0 = _mm_cvtsi128_si32(res_8_lo_0);
      *(int *)dst8_1 = _mm_cvtsi128_si32(res_8_lo_1);
    } else {
      const __m128i temp_lo_16_0 = _mm256_castsi256_si128(temp_lo_16);
      const __m128i temp_lo_16_1 = _mm256_extracti128_si256(temp_lo_16, 1);
      _mm_storel_epi64(p_0, temp_lo_16_0);
      _mm_storel_epi64(p_1, temp_lo_16_1);
    }
    if (p_width > 4) {
      __m128i *const p4_0 =
          (__m128i *)&conv_params
              ->dst[(i + k + 4) * conv_params->dst_stride + j + 4];
      __m128i *const p4_1 =
          (__m128i *)&conv_params
              ->dst[(i + (k + 1) + 4) * conv_params->dst_stride + j + 4];
      res_hi_1 = _mm256_srai_epi32(_mm256_add_epi32(res_hi_1, *res_add_const),
                                   reduce_bits_vert);
      const __m256i temp_hi_16 = _mm256_packus_epi32(res_hi_1, res_hi_1);
      __m256i res_hi_16;
      if (conv_params->do_average) {
        __m128i *const dst8_4_0 =
            (__m128i *)&pred[(i + k + 4) * p_stride + j + 4];
        __m128i *const dst8_4_1 =
            (__m128i *)&pred[(i + (k + 1) + 4) * p_stride + j + 4];
        const __m128i p4_16_0 = _mm_loadl_epi64(p4_0);
        const __m128i p4_16_1 = _mm_loadl_epi64(p4_1);
        const __m256i p4_16 = _mm256_inserti128_si256(
            _mm256_castsi128_si256(p4_16_0), p4_16_1, 1);
        if (conv_params->use_dist_wtd_comp_avg) {
          const __m256i p_16_hi = _mm256_unpacklo_epi16(p4_16, temp_hi_16);
          const __m256i wt_res_hi = _mm256_madd_epi16(p_16_hi, *wt);
          const __m256i shifted_32 =
              _mm256_srai_epi32(wt_res_hi, DIST_PRECISION_BITS);
          res_hi_16 = _mm256_packus_epi32(shifted_32, shifted_32);
        } else {
          res_hi_16 = _mm256_srai_epi16(_mm256_add_epi16(p4_16, temp_hi_16), 1);
        }
        res_hi_16 = _mm256_add_epi16(res_hi_16, *res_sub_const);
        res_hi_16 = _mm256_srai_epi16(
            _mm256_add_epi16(res_hi_16, *round_bits_const), round_bits);
        __m256i res_8_hi = _mm256_packus_epi16(res_hi_16, res_hi_16);
        const __m128i res_8_hi_0 = _mm256_castsi256_si128(res_8_hi);
        const __m128i res_8_hi_1 = _mm256_extracti128_si256(res_8_hi, 1);
        *(int *)dst8_4_0 = _mm_cvtsi128_si32(res_8_hi_0);
        *(int *)dst8_4_1 = _mm_cvtsi128_si32(res_8_hi_1);
      } else {
        const __m128i temp_hi_16_0 = _mm256_castsi256_si128(temp_hi_16);
        const __m128i temp_hi_16_1 = _mm256_extracti128_si256(temp_hi_16, 1);
        _mm_storel_epi64(p4_0, temp_hi_16_0);
        _mm_storel_epi64(p4_1, temp_hi_16_1);
      }
    }
  } else {
    const __m256i res_lo_round = _mm256_srai_epi32(
        _mm256_add_epi32(res_lo_1, *res_add_const), reduce_bits_vert);
    const __m256i res_hi_round = _mm256_srai_epi32(
        _mm256_add_epi32(res_hi_1, *res_add_const), reduce_bits_vert);

    const __m256i res_16bit = _mm256_packs_epi32(res_lo_round, res_hi_round);
    const __m256i res_8bit = _mm256_packus_epi16(res_16bit, res_16bit);
    const __m128i res_8bit0 = _mm256_castsi256_si128(res_8bit);
    const __m128i res_8bit1 = _mm256_extracti128_si256(res_8bit, 1);

    // Store, blending with 'pred' if needed
    __m128i *const p = (__m128i *)&pred[(i + k + 4) * p_stride + j];
    __m128i *const p1 = (__m128i *)&pred[(i + (k + 1) + 4) * p_stride + j];

    if (p_width == 4) {
      *(int *)p = _mm_cvtsi128_si32(res_8bit0);
      *(int *)p1 = _mm_cvtsi128_si32(res_8bit1);
    } else {
      _mm_storel_epi64(p, res_8bit0);
      _mm_storel_epi64(p1, res_8bit1);
    }
  }
}